

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void __thiscall RandStrRepeat::generate(RandStrRepeat *this,wchar_t **dst)

{
  RandStrNode *pRVar1;
  uint32_t uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  
  if (this->hi < 0) {
    for (iVar4 = 0; iVar4 < this->lo; iVar4 = iVar4 + 1) {
      pRVar1 = (this->super_RandStrNode).firstChild;
      (*pRVar1->_vptr_RandStrNode[3])(pRVar1,dst);
    }
    uVar5 = 0;
    while( true ) {
      uVar2 = rng_next();
      uVar3 = rand_range((ulong)uVar2,100);
      if ((0x42 < (uint)uVar3) || (0x31 < uVar5)) break;
      pRVar1 = (this->super_RandStrNode).firstChild;
      (*pRVar1->_vptr_RandStrNode[3])(pRVar1,dst);
      uVar5 = uVar5 + 1;
    }
  }
  else {
    uVar2 = rng_next();
    uVar3 = rand_range((ulong)uVar2,(long)this->lo,(long)this->hi);
    while (bVar6 = uVar3 != 0, uVar3 = uVar3 - 1, bVar6) {
      pRVar1 = (this->super_RandStrNode).firstChild;
      (*pRVar1->_vptr_RandStrNode[3])(pRVar1,dst);
    }
  }
  return;
}

Assistant:

virtual void generate(VMG_ wchar_t *&dst)
    {
        if (hi >= 0)
        {
            /* 
             *   Finite upper bound.  Pick a random repeat count from lo to
             *   hi, and generate our child that many times.  
             */
            for (ulong cnt = rand_range(rng_next(vmg0_), lo, hi) ;
                 cnt != 0 ; --cnt)
                firstChild->generate(vmg_ dst);
        }
        else
        {
            /* no upper bound - start with the fixed lower bound */
            int i;
            for (i = 0 ; i < lo ; ++i)
                firstChild->generate(vmg_ dst);

            /* 
             *   Now add additional items one at a time, with 67% probability
             *   for each added item.  Stop when we fail the roll.  
             */
            for (i = 0 ;
                 rand_range(rng_next(vmg0_), 0, 99) < 67 && i < MAX_UNBOUNDED ;
                 ++i)
                firstChild->generate(vmg_ dst);
        }
    }